

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O0

void zmDivMont(word *b,word *divident,word *a,qr_o *r,void *stack)

{
  word *in_RCX;
  word *in_RDX;
  word *in_RSI;
  qr_o *in_R8;
  word *c;
  void *in_stack_ffffffffffffffc8;
  qr_o *r_00;
  
  r_00 = (qr_o *)(&(in_R8->hdr).keep + in_RCX[6]);
  zmInvMont(in_RCX,(word *)r_00,in_R8,in_stack_ffffffffffffffc8);
  zmMulMont(in_RSI,in_RDX,in_RCX,r_00,in_R8);
  return;
}

Assistant:

static void zmDivMont(word b[], const word divident[], const word a[],
	const qr_o* r, void* stack)
{
	word* c = (word*)stack;
	ASSERT(zmIsOperable(r));
	ASSERT(zmIsIn(divident, r));
	ASSERT(zmIsIn(a, r));
	stack = c + r->n;
	// c <- a^{(-1)} (в кольце Монтгомери)
	zmInvMont(c, a, r, stack);
	// b <- divident * c
	zmMulMont(b, divident, c, r, stack);
}